

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::prepare(SlicePlane *this)

{
  initializer_list<glm::vec<4,_float,_(glm::qualifier)0>_> __l;
  long *plVar1;
  element_type *peVar2;
  size_type in_RDI;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  positions;
  vec4 v4;
  vec4 v3;
  vec4 v2;
  vec4 v1;
  vec4 cVert;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffffdc8;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffffdd0;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *this_00;
  allocator_type *__a;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *this_01;
  iterator pvVar3;
  allocator local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [25];
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [24];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  vec<4,float,(glm::qualifier)0> local_78 [16];
  vec<4,_float,_(glm::qualifier)0> local_68;
  undefined8 local_58;
  allocator local_39;
  string local_38 [32];
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  local_18;
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"SLICE_PLANE",&local_39);
  local_68.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_68.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_68.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_68.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_58 = 0;
  pvVar3 = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x460743);
  (**(code **)(*plVar1 + 0x158))(&local_18,plVar1,local_38,pvVar3,3);
  this_00 = &local_18;
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x460799);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  __a = (allocator_type *)0x0;
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>(local_78,0.0,0.0,0.0,1.0);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
            ((vec<4,float,(glm::qualifier)0> *)&local_88,(double)__a,(double)__a,1.0,(double)__a);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
            ((vec<4,float,(glm::qualifier)0> *)&local_98,(double)__a,1.0,(double)__a,(double)__a);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
            ((vec<4,float,(glm::qualifier)0> *)&local_a8,(double)__a,(double)__a,-1.0,(double)__a);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
            ((vec<4,float,(glm::qualifier)0> *)&local_b8,(double)__a,-1.0,(double)__a,(double)__a);
  local_1a9[1] = local_78[0];
  local_1a9[2] = local_78[1];
  local_1a9[3] = local_78[2];
  local_1a9[4] = local_78[3];
  local_1a9[5] = local_78[4];
  local_1a9[6] = local_78[5];
  local_1a9[7] = local_78[6];
  local_1a9[8] = local_78[7];
  local_1a9[9] = local_78[8];
  local_1a9[10] = local_78[9];
  local_1a9[0xb] = local_78[10];
  local_1a9[0xc] = local_78[0xb];
  local_1a9[0xd] = local_78[0xc];
  local_1a9[0xe] = local_78[0xd];
  local_1a9[0xf] = local_78[0xe];
  local_1a9[0x10] = local_78[0xf];
  local_1a9._17_8_ = local_98;
  uStack_190 = uStack_90;
  local_188 = local_88;
  uStack_180 = uStack_80;
  local_178 = local_78._0_8_;
  uStack_170 = local_78._8_8_;
  local_168 = local_a8;
  uStack_160 = uStack_a0;
  local_158 = local_98;
  uStack_150 = uStack_90;
  local_148 = local_78._0_8_;
  uStack_140 = local_78._8_8_;
  local_138 = local_b8;
  uStack_130 = uStack_b0;
  local_128 = local_a8;
  uStack_120 = uStack_a0;
  local_118 = local_78._0_8_;
  uStack_110 = local_78._8_8_;
  local_108 = local_88;
  uStack_100 = uStack_80;
  local_f8 = local_b8;
  uStack_f0 = uStack_b0;
  local_e0 = local_1a9 + 1;
  local_d8 = 0xc;
  this_01 = (vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             *)local_1a9;
  std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<4,_float,_(glm::qualifier)0>_> *)0x46097f);
  __l._M_len = in_RDI;
  __l._M_array = pvVar3;
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::vector(this_01,__l,__a);
  std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<4,_float,_(glm::qualifier)0>_> *)0x4609b0);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4609c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"a_position",&local_1d1);
  (*peVar2->_vptr_ShaderProgram[0x16])(peVar2,local_1d0,local_d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

void SlicePlane::prepare() {

  planeProgram = render::engine->requestShader("SLICE_PLANE", {}, render::ShaderReplacementDefaults::Process);

  // Geometry of the plane, using triangles with vertices at infinity
  glm::vec4 cVert{0., 0., 0., 1.};
  glm::vec4 v1{0., 0., 1., 0.};
  glm::vec4 v2{0., 1., 0., 0.};
  glm::vec4 v3{0., 0., -1., 0.};
  glm::vec4 v4{0., -1., 0., 0.};

  // clang-format off
  std::vector<glm::vec4> positions = {
    cVert, v2, v1,
    cVert, v3, v2,
    cVert, v4, v3,
    cVert, v1, v4
  };
  // clang-format on

  planeProgram->setAttribute("a_position", positions);
}